

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

bool MakeAMove(Situation *situation,Movement *move,bool isbegin)

{
  pointer *ppMVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  pointer pMVar6;
  iterator __position;
  bool bVar7;
  UINT8 UVar8;
  undefined2 uVar9;
  UINT8 UVar10;
  undefined1 uVar11;
  UINT32 UVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  UINT8 *pUVar16;
  bool bVar17;
  bool bVar18;
  
  bVar2 = move->from;
  bVar3 = situation->current_board[bVar2];
  bVar4 = move->to;
  bVar5 = situation->current_board[bVar4];
  uVar14 = (ulong)bVar5;
  ZobristKey = ZobristKey ^ ZobristPlayer ^ ZobristTable[bVar3][bVar2];
  if (uVar14 != 0) {
    ZobristKey = ZobristKey ^ ZobristTable[bVar5][bVar4];
  }
  ZobristKey = ZobristKey ^ ZobristTable[bVar3][bVar4];
  ZobristKeyCheck = ZobristKeyCheck ^ ZobristPlayerCheck ^ ZobristTableCheck[bVar3][bVar2];
  if (uVar14 != 0) {
    ZobristKeyCheck = ZobristKeyCheck ^ ZobristTableCheck[bVar5][bVar4];
  }
  ZobristKeyCheck = ZobristKeyCheck ^ ZobristTableCheck[situation->current_board[bVar2]][bVar4];
  iVar13 = PIECE_NUM_TO_TYPE[bVar3];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] -
       PiecesValue[situation->current_player][iVar13][bVar2];
  situation->value[situation->current_player] =
       situation->value[situation->current_player] +
       PiecesValue[situation->current_player][iVar13][bVar4];
  if (uVar14 == 0) {
    situation->bit_row[bVar2 >> 4] =
         situation->bit_row[bVar2 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->bit_col[bVar2 & 0xf] =
         situation->bit_col[bVar2 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->bit_row[bVar4 >> 4] =
         situation->bit_row[bVar4 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar4 + (uint)bVar4));
    situation->bit_col[bVar4 & 0xf] =
         situation->bit_col[bVar4 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar4 + (uint)bVar4));
    situation->current_board[bVar2] = '\0';
    situation->current_board[move->to] = bVar3;
    situation->current_pieces[bVar3] = move->to;
  }
  else {
    bVar17 = (bVar5 & 0x10) == 0;
    situation->value[bVar17] =
         situation->value[bVar17] - PiecesValue[bVar17][PIECE_NUM_TO_TYPE[uVar14]][bVar4];
    situation->bit_row[bVar2 >> 4] =
         situation->bit_row[bVar2 >> 4] ^
         *(ushort *)((long)BIT_ROW_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->bit_col[bVar2 & 0xf] =
         situation->bit_col[bVar2 & 0xf] ^
         *(ushort *)((long)BIT_COL_MASK + (ulong)((uint)bVar2 + (uint)bVar2));
    situation->current_board[bVar2] = '\0';
    situation->current_board[move->to] = bVar3;
    situation->current_pieces[bVar3] = move->to;
    situation->current_pieces[uVar14] = '\0';
  }
  bVar18 = true;
  bVar17 = true;
  if (isbegin) {
    iVar13 = Catch(situation,move);
    move->catc = (UINT8)iVar13;
    move->movec = bVar3;
    bVar17 = true;
    if ((UINT8)iVar13 == '\0') {
      iVar13 = CheckOpponent(situation);
      if (iVar13 == 0) {
        bVar17 = false;
      }
      else {
        move->catc = (char)situation->current_player * -0x10 + ' ';
        move->movec = (UINT8)iVar13;
      }
    }
    pMVar6 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar14 = ((long)(situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 2) *
             -0x5555555555555555;
    if (move->catc != '\0' && 5 < uVar14) {
      lVar15 = (long)((int)uVar14 + -1);
      pUVar16 = &pMVar6[lVar15 + -1].movec;
      uVar14 = 0xffffffffffffffff;
      do {
        bVar7 = false;
        if ((pUVar16[-1] != move->catc) || (bVar7 = false, *pUVar16 != move->movec)) break;
        uVar14 = uVar14 + 2;
        pUVar16 = pUVar16 + -0x18;
        bVar7 = bVar17;
      } while (uVar14 < 4);
      bVar18 = pMVar6[lVar15].catc != '\0';
      bVar17 = bVar7;
      if ((bVar7) && (pMVar6[lVar15].movec != '\0')) {
        pUVar16 = &pMVar6[lVar15 + -2].movec;
        uVar14 = 0;
        bVar17 = true;
        do {
          if ((pUVar16[-1] != pMVar6[lVar15].catc) || (*pUVar16 != pMVar6[lVar15].movec)) {
            bVar18 = false;
            break;
          }
          uVar14 = uVar14 + 2;
          pUVar16 = pUVar16 + -0x18;
        } while (uVar14 < 3);
      }
    }
  }
  __position._M_current =
       (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Movement,std::allocator<Movement>>::_M_realloc_insert<Movement_const&>
              ((vector<Movement,std::allocator<Movement>> *)&situation->moves_stack,__position,move)
    ;
  }
  else {
    UVar8 = move->movec;
    uVar9 = *(undefined2 *)&move->field_0xa;
    (__position._M_current)->catc = move->catc;
    (__position._M_current)->movec = UVar8;
    *(undefined2 *)&(__position._M_current)->field_0xa = uVar9;
    UVar8 = move->to;
    UVar10 = move->capture;
    uVar11 = move->field_0x3;
    UVar12 = move->value;
    (__position._M_current)->from = move->from;
    (__position._M_current)->to = UVar8;
    (__position._M_current)->capture = UVar10;
    (__position._M_current)->field_0x3 = uVar11;
    (__position._M_current)->value = UVar12;
    ppMVar1 = &(situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  step = step + 1;
  if ((!bVar18 && isbegin) && bVar17) {
    situation->current_player = 1 - situation->current_player;
  }
  else {
    bVar17 = BeChecked(situation);
    situation->current_player = 1 - situation->current_player;
    if (!bVar17) {
      bVar17 = KingFacing(situation);
      return bVar17;
    }
  }
  return true;
}

Assistant:

bool MakeAMove(Situation & situation,Movement & move, bool isbegin){

    int piece_id_from = situation.current_board[move.from];
    int piece_id_to = situation.current_board[move.to];

    

    // 1. 置换表更新
    // 1.1 当前局面哈希值
    ZobristKey ^= ZobristPlayer;
    ZobristKey ^= ZobristTable[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKey ^= ZobristTable[piece_id_to][move.to];
    ZobristKey ^= ZobristTable[piece_id_from][move.to];

    //  1.2 当前局面哈希校验值
    ZobristKeyCheck ^= ZobristPlayerCheck;
    ZobristKeyCheck ^= ZobristTableCheck[piece_id_from][move.from];
    if(piece_id_to != 0)
        ZobristKeyCheck ^= ZobristTableCheck[piece_id_to][move.to];
    ZobristKeyCheck ^= ZobristTableCheck[situation.current_board[move.from]][move.to];

    // 2. 更新子力价值
    situation.value[situation.current_player] -= PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.from];
    situation.value[situation.current_player] += PiecesValue[situation.current_player][PIECE_NUM_TO_TYPE[piece_id_from]][move.to];

    // 3. 移动棋子
    // 4.1 如果是吃子着法
    if(piece_id_to != 0){
        // 4.1.1 更新子力价值
        situation.value[ColorOfPiece(piece_id_to)] -= PiecesValue[ColorOfPiece(piece_id_to)][PIECE_NUM_TO_TYPE[piece_id_to]][move.to];
        // 4.1.2 只更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
        situation.current_pieces[piece_id_to] = 0;
    }else{
        // 4.1.1 更新起始格的位行位列
        int row = GetRow(move.from), col = GetCol(move.from);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.from];
        situation.bit_col[col] ^= BIT_COL_MASK[move.from];
        // 4.1.2 更新目标格的位行位列
        row = GetRow(move.to), col = GetCol(move.to);
        situation.bit_row[row] ^= BIT_ROW_MASK[move.to];
        situation.bit_col[col] ^= BIT_COL_MASK[move.to];
        // 4.1.3 更新棋子棋盘数组
        situation.current_board[move.from] = 0;
        situation.current_board[move.to] = piece_id_from;
        situation.current_pieces[piece_id_from] = move.to;
    
    }

    // 4. 如果是开始转换局面或者试探局面，则需要判断该着法是否抓子，抓的是哪个子
    int longcatme = 1, longcatopp = 1;
    if(isbegin){
        move.catc = Catch(situation, move);
        move.movec = piece_id_from;
        if(move.catc == 0){
            int check = CheckOpponent(situation);
            if(check){
                move.catc = GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0;
                move.movec = check;
            }else longcatme = 0;
        }
        // 判断自己是否已经走了6步同一子a捉同一子b
        if(situation.moves_stack.size() >= 6 && move.catc){
            int last_index = situation.moves_stack.size() - 1;
            for(int i = 1; i <= 5; i += 2){
                if(!(situation.moves_stack[last_index - i].catc == move.catc && situation.moves_stack[last_index - i].movec == move.movec)){
                    longcatme = 0;
                    break;
                }
            }
            // 如果自己长抓，判断对方是否也长抓
            int movec = situation.moves_stack[last_index].movec;
            int catc = situation.moves_stack[last_index].catc;
            if(catc == 0) longcatopp = 0;
            if(longcatme && movec){
                for(int i = 2; i <= 4; i += 2){
                    if(!(situation.moves_stack[last_index - i].catc == catc && situation.moves_stack[last_index - i].movec == movec)){
                        longcatopp = 0;
                        break;
                    }
                }
            }
        }
    }

    // 5. 放入走法栈
    situation.moves_stack.push_back(move);
    step++;

    // 自己长抓，对方没长抓，则返回true
    if(isbegin && longcatme && !longcatopp){
        ChangePlayer(situation.current_player);
        return true;
    }

    // 6. 交换走棋方
    if(BeChecked(situation)){
        ChangePlayer(situation.current_player);
        return true;
    }
    ChangePlayer(situation.current_player);
    return KingFacing(situation);
}